

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_combo_callback(nk_context *ctx,_func_void_void_ptr_int_char_ptr_ptr *item_getter,
                     void *userdata,int selected,int count,int item_height,nk_vec2 size)

{
  nk_vec2 nVar1;
  nk_bool nVar2;
  int iVar3;
  float fVar4;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar5;
  char *item;
  char *local_70;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  ulong local_50;
  undefined1 local_48 [24];
  
  if (item_getter != (_func_void_void_ptr_int_char_ptr_ptr *)0x0 && ctx != (nk_context *)0x0) {
    local_68 = (ulong)(uint)(int)(ctx->style).window.spacing.y;
    local_48._8_4_ = in_XMM0_Dc;
    local_48._0_8_ = size;
    local_48._12_4_ = in_XMM0_Dd;
    nVar1 = nk_panel_get_padding(&ctx->style,ctx->current->layout->type);
    fVar4 = (float)(((int)local_68 + item_height) * count + ((int)nVar1.y + (int)local_68) * 2);
    fVar5 = (float)local_48._4_4_;
    if (fVar4 <= (float)local_48._4_4_) {
      fVar5 = fVar4;
    }
    local_68 = CONCAT44(local_48._4_4_,fVar5);
    fStack_60 = (float)local_48._4_4_;
    fStack_5c = (float)local_48._4_4_;
    local_50 = (ulong)(uint)item_height;
    (*item_getter)(userdata,selected,&local_70);
    nVar1.y = (float)local_68;
    nVar1.x = (float)local_48._0_4_;
    nVar2 = nk_combo_begin_label(ctx,local_70,nVar1);
    if (nVar2 != 0) {
      iVar3 = 0;
      nk_row_layout(ctx,NK_DYNAMIC,(float)(int)local_50,1,0);
      if (0 < count) {
        do {
          (*item_getter)(userdata,iVar3,&local_70);
          nVar2 = nk_contextual_item_label(ctx,local_70,0x11);
          if (nVar2 != 0) {
            selected = iVar3;
          }
          iVar3 = iVar3 + 1;
        } while (count != iVar3);
      }
      nk_contextual_end(ctx);
    }
  }
  return selected;
}

Assistant:

NK_API int
nk_combo_callback(struct nk_context *ctx, void(*item_getter)(void*, int, const char**),
void *userdata, int selected, int count, int item_height, struct nk_vec2 size)
{
int i;
int max_height;
struct nk_vec2 item_spacing;
struct nk_vec2 window_padding;
const char *item;

NK_ASSERT(ctx);
NK_ASSERT(item_getter);
if (!ctx || !item_getter)
return selected;

/* calculate popup window */
item_spacing = ctx->style.window.spacing;
window_padding = nk_panel_get_padding(&ctx->style, ctx->current->layout->type);
max_height = count * item_height + count * (int)item_spacing.y;
max_height += (int)item_spacing.y * 2 + (int)window_padding.y * 2;
size.y = NK_MIN(size.y, (float)max_height);

item_getter(userdata, selected, &item);
if (nk_combo_begin_label(ctx, item, size)) {
nk_layout_row_dynamic(ctx, (float)item_height, 1);
for (i = 0; i < count; ++i) {
item_getter(userdata, i, &item);
if (nk_combo_item_label(ctx, item, NK_TEXT_LEFT))
selected = i;
}
nk_combo_end(ctx);
} return selected;
}